

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.cpp
# Opt level: O2

string * hedg::Timing::now_abi_cxx11_(void)

{
  tm *__tp;
  string *in_RDI;
  allocator<char> local_19;
  time_t now;
  
  now = time((time_t *)0x0);
  __tp = gmtime(&now);
  strftime(buf,0x15,"%FT%TZ",__tp);
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,buf,&local_19);
  return in_RDI;
}

Assistant:

std::string Timing::now() {
	std::time_t now = std::time(0);
	tm* gmtm = gmtime(&now);
	std::strftime(buf, time_size, "%FT%TZ", gmtm);
	return buf;
}